

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O0

void __thiscall ezexample::setup_for_predict(ezexample *this)

{
  int iVar1;
  long in_RDI;
  ezexample *in_stack_00000010;
  example *in_stack_00000198;
  vw *in_stack_000001a0;
  char *in_stack_ffffffffffffffc8;
  vw *in_stack_ffffffffffffffd0;
  
  if (setup_for_predict()::empty_example == '\0') {
    iVar1 = __cxa_guard_acquire(&setup_for_predict()::empty_example);
    if (iVar1 != 0) {
      if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
        setup_for_predict::empty_example = (example *)0x0;
      }
      else {
        setup_for_predict::empty_example =
             VW::read_example(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      }
      __cxa_guard_release(&setup_for_predict()::empty_example);
    }
  }
  if ((*(byte *)(in_RDI + 0x155) & 1) != 0) {
    mini_setup_example(in_stack_00000010);
    vw::learn(in_stack_000001a0,in_stack_00000198);
    if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
      vw::learn(in_stack_000001a0,in_stack_00000198);
    }
    *(undefined1 *)(in_RDI + 0x155) = 0;
  }
  return;
}

Assistant:

void setup_for_predict()
  {
    static example* empty_example = is_multiline ? VW::read_example(*vw_par_ref, (char*)"") : nullptr;
    if (example_changed_since_prediction)
    {
      mini_setup_example();
      vw_ref->learn(*ec);
      if (is_multiline)
        vw_ref->learn(*empty_example);
      example_changed_since_prediction = false;
    }
  }